

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O3

double esum(int *mu,double *x)

{
  int iVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = *x;
  iVar1 = *mu;
  dVar3 = (double)iVar1;
  if (dVar2 <= 0.0) {
    if ((iVar1 < 0) || (0.0 < dVar2 + dVar3)) goto LAB_00106fc2;
  }
  else if ((0 < iVar1) || (dVar2 + dVar3 < 0.0)) {
LAB_00106fc2:
    dVar2 = exp(dVar3);
    dVar3 = exp(*x);
    return dVar3 * dVar2;
  }
  dVar2 = exp(dVar2 + dVar3);
  return dVar2;
}

Assistant:

double esum(int *mu,double *x)
/*
-----------------------------------------------------------------------
                    EVALUATION OF EXP(MU + X)
-----------------------------------------------------------------------
*/
{
static double esum,w;
/*
     ..
     .. Executable Statements ..
*/
    if(*x > 0.0e0) goto S10;
    if(*mu < 0) goto S20;
    w = (double)*mu+*x;
    if(w > 0.0e0) goto S20;
    esum = exp(w);
    return esum;
S10:
    if(*mu > 0) goto S20;
    w = (double)*mu+*x;
    if(w < 0.0e0) goto S20;
    esum = exp(w);
    return esum;
S20:
    w = *mu;
    esum = exp(w)*exp(*x);
    return esum;
}